

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UniqueRenderResource.h
# Opt level: O3

void __thiscall
Rml::UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
::ReleaseInDerived(UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
                   *this)

{
  Mesh local_38;
  
  Geometry::Release(&local_38,(Geometry *)this,ReturnMesh);
  if (local_38.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_38.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_38.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_38.vertices.super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.vertices.super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_38.vertices.
                          super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.vertices.
                          super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void MoveFrom(UniqueRenderResource& other) noexcept
	{
		render_manager = std::exchange(other.render_manager, nullptr);
		resource_handle = std::exchange(other.resource_handle, InvalidHandleValue);
	}